

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall BpTree<float>::FindNode(BpTree<float> *this,Addr p,IndexNode<float> *Node)

{
  pointer pcVar1;
  int BlockNum;
  ostream *poVar2;
  int FileOff;
  string local_70;
  string local_50;
  
  if ((ulong)p >> 0x20 != 0xffffffff) {
    pcVar1 = (this->Index_FileName)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (this->Index_FileName)._M_string_length);
    FileOff = p.FileOff;
    BlockNum = Buffer::Find(&blocks,&local_50,FileOff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (BlockNum == -1) {
      pcVar1 = (this->Index_FileName)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + (this->Index_FileName)._M_string_length);
      BlockNum = Buffer::Allocate(&blocks,&local_70,FileOff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    (Node->self).BlockNum = BlockNum;
    (Node->self).FileOff = FileOff;
    Block2Node(this,BlockNum,Node);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Wrong address!");
  std::endl<char,std::char_traits<char>>(poVar2);
  system("pause");
  exit(1);
}

Assistant:

void BpTree<K>::FindNode(Addr p, IndexNode<K>& Node) {
	if (p.FileOff == -1) {
		cout << "Wrong address!" << endl;
		system("pause");
		exit(1);
	}
	int BlockNum = blocks.Find(this->Index_FileName, p.FileOff);		//���Ҹÿ��Ƿ�����buffer����
	if (BlockNum == -1) {
		BlockNum = blocks.Allocate(this->Index_FileName, p.FileOff);	//���û�У�������һ��
	}
	Node.self.BlockNum = BlockNum;										//��ַp�еĿ�Ų�����
	Node.self.FileOff = p.FileOff;
	this->Block2Node(BlockNum, Node);									//��������Ϣ���ർ���㵱��
}